

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::isEquivalentTo(TimeArrayTimeZoneRule *this,TimeZoneRule *other)

{
  _func_int **pp_Var1;
  bool bVar2;
  UBool UVar3;
  int local_30;
  int32_t i;
  UBool res;
  TimeArrayTimeZoneRule *that;
  TimeZoneRule *other_local;
  TimeArrayTimeZoneRule *this_local;
  
  if (this == (TimeArrayTimeZoneRule *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (TimeArrayTimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if ((!bVar2) &&
       (UVar3 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar3 != '\0')) {
      if ((this->fTimeRuleType == *(TimeRuleType *)&other[1].super_UObject._vptr_UObject) &&
         (this->fNumStartTimes == *(int *)((long)&other[1].super_UObject._vptr_UObject + 4))) {
        local_30 = 0;
        while( true ) {
          if (this->fNumStartTimes <= local_30) {
            return '\x01';
          }
          pp_Var1 = other[1].fName.super_Replaceable.super_UObject._vptr_UObject + local_30;
          if ((this->fStartTimes[local_30] != (double)*pp_Var1) ||
             (NAN(this->fStartTimes[local_30]) || NAN((double)*pp_Var1))) break;
          local_30 = local_30 + 1;
        }
        return '\0';
      }
      return '\0';
    }
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeArrayTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    TimeArrayTimeZoneRule* that = (TimeArrayTimeZoneRule*)&other;
    if (fTimeRuleType != that->fTimeRuleType ||
        fNumStartTimes != that->fNumStartTimes) {
        return FALSE;
    }
    // Compare start times
    UBool res = TRUE;
    for (int32_t i = 0; i < fNumStartTimes; i++) {
        if (fStartTimes[i] != that->fStartTimes[i]) {
            res = FALSE;
            break;
        }
    }
    return res;
}